

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

size_t __thiscall
CVmObjDate::format_date
          (CVmObjDate *this,char *buf,size_t buflen,char *fmt,size_t fmtlen,CVmDateLocale *lc,
          multicaldate_t *date,int32_t dayno,int32_t daytime,char *tzabbr,int32_t tzofs)

{
  bignum_t<32> b;
  CVmObject *pCVar1;
  int32_t iVar2;
  uint uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar4;
  char *fmt_00;
  CVmObjDate *pCVar5;
  CVmObjDate *pCVar6;
  char *lc_00;
  char *in_RCX;
  size_t *outlen_00;
  CVmObjDate *in_RDX;
  CVmObjDate *extraout_RDX;
  CVmObjDate *extraout_RDX_00;
  CVmObjDate *extraout_RDX_01;
  CVmObjDate *extraout_RDX_02;
  CVmObjDate *extraout_RDX_03;
  CVmObjDate *extraout_RDX_04;
  CVmObjDate *extraout_RDX_05;
  CVmObjDate *extraout_RDX_06;
  CVmObjDate *extraout_RDX_07;
  CVmObjDate *extraout_RDX_08;
  CVmObjDate *extraout_RDX_09;
  CVmObjDate *extraout_RDX_10;
  CVmObjDate *extraout_RDX_11;
  CVmObjDate *extraout_RDX_12;
  CVmObjDate *extraout_RDX_13;
  CVmObjDate *extraout_RDX_14;
  CVmObjDate *extraout_RDX_15;
  CVmObjDate *extraout_RDX_16;
  CVmObjDate *extraout_RDX_17;
  CVmObjDate *extraout_RDX_18;
  CVmObjDate *extraout_RDX_19;
  CVmObjDate *extraout_RDX_20;
  CVmObjDate *extraout_RDX_21;
  CVmObjDate *extraout_RDX_22;
  CVmObjDate *extraout_RDX_23;
  CVmObjDate *extraout_RDX_24;
  CVmObjDate *extraout_RDX_25;
  CVmObjDate *extraout_RDX_26;
  CVmObjDate *extraout_RDX_27;
  CVmObjDate *extraout_RDX_28;
  CVmObjDate *in_RSI;
  char **in_RDI;
  int iVar7;
  char *in_R8;
  int iVar8;
  CVmDateLocale *in_R9;
  multicaldate_t *unaff_retaddr;
  int32_t in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  int32_t in_stack_00000020;
  undefined4 in_stack_00000024;
  int in_stack_00000028;
  char ubuf [60];
  double utime;
  int32_t o;
  char *p;
  size_t l;
  int hh;
  int yy;
  int idx;
  int iy;
  char jbuf [64];
  bignum_t<32> bdt;
  bignum_t<32> bdn;
  long dt;
  long dn;
  int j;
  caldate_t jan1;
  int found_flag;
  char leadsp;
  int roman;
  int minus;
  int pound;
  size_t outlen;
  size_t subfmtl;
  char *subfmt;
  char *in_stack_fffffffffffffdd8;
  undefined4 uVar9;
  bignum_t<32> *in_stack_fffffffffffffde0;
  int item;
  undefined4 uVar10;
  int in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  bignum_t<32> *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  multicaldate_t *in_stack_fffffffffffffe00;
  CVmDateLocale *in_stack_fffffffffffffe08;
  CVmDateLocale *pCVar11;
  int in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  CVmDateLocale *in_stack_fffffffffffffe30;
  int pound_00;
  int ndigits;
  CVmDateLocale *in_stack_fffffffffffffe38;
  int v;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 uVar12;
  char local_1a8 [8];
  char in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  char *local_150;
  uint local_134;
  undefined1 local_11c [76];
  char *local_d0;
  bignum_t<32> *local_c8;
  int local_c0;
  undefined1 local_bc;
  long local_90;
  long local_88;
  int local_7c;
  caldate_t local_78;
  int local_6c;
  char local_65;
  undefined4 local_64;
  int local_60;
  uint local_5c;
  char *local_58;
  char *local_50;
  CVmDateLocale *pCVar13;
  CVmObjDate *buf_00;
  CVmObjDate *pCVar14;
  
  local_58 = (char *)0x0;
  pCVar11 = in_R9;
  fmt_00 = in_R8;
  buf_00 = in_RDX;
  pCVar14 = in_RSI;
  do {
    if (fmt_00 == (char *)0x0) {
      if (buf_00 != (CVmObjDate *)0x0) {
        *(char *)&(pCVar14->super_CVmObject)._vptr_CVmObject = '\0';
      }
      return (size_t)local_58;
    }
    if ((*in_RCX != '%') || (fmt_00 < (char *)0x2)) {
      local_58 = local_58 + 1;
      if (buf_00 != (CVmObjDate *)0x0) {
        in_RDX = (CVmObjDate *)((long)&(pCVar14->super_CVmObject)._vptr_CVmObject + 1);
        *(char *)&(pCVar14->super_CVmObject)._vptr_CVmObject = *in_RCX;
        buf_00 = (CVmObjDate *)((long)&buf_00[-1].super_CVmObject.ext_ + 7);
        pCVar14 = in_RDX;
      }
      goto LAB_002f2ac1;
    }
    in_RCX = in_RCX + 1;
    fmt_00 = fmt_00 + -1;
    local_5c = 0;
    local_60 = 0;
    local_64 = 0;
    local_65 = '\0';
    local_6c = 1;
    while (uVar12 = local_6c != 0 && (char *)0x1 < fmt_00, local_6c != 0 && (char *)0x1 < fmt_00) {
      local_6c = 0;
      if (((char *)0x1 < fmt_00) && (*in_RCX == '#')) {
        local_6c = 1;
        local_5c = 1;
        in_RCX = in_RCX + 1;
        fmt_00 = fmt_00 + -1;
      }
      if (((char *)0x1 < fmt_00) && ((*in_RCX == ' ' || (*in_RCX == '\x15')))) {
        local_65 = *in_RCX;
        local_6c = 1;
        in_RCX = in_RCX + 1;
        fmt_00 = fmt_00 + -1;
      }
      if (((char *)0x1 < fmt_00) && (*in_RCX == '-')) {
        local_6c = 1;
        local_60 = 1;
        in_RCX = in_RCX + 1;
        fmt_00 = fmt_00 + -1;
      }
      if (((char *)0x1 < fmt_00) && (*in_RCX == '&')) {
        local_6c = 1;
        local_64 = 1;
        in_RCX = in_RCX + 1;
        fmt_00 = fmt_00 + -1;
      }
    }
    outlen_00 = (size_t *)(ulong)((int)*in_RCX - 0x25);
    iVar4 = (int)in_RDX;
    iVar7 = (int)in_R8;
    iVar8 = (int)in_R9;
    uVar3 = (uint)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    item = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    pound_00 = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    ndigits = (int)in_stack_fffffffffffffe38;
    v = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    switch(outlen_00) {
    case (size_t *)0x0:
      local_58 = local_58 + 1;
      if (buf_00 != (CVmObjDate *)0x0) {
        *(char *)&(pCVar14->super_CVmObject)._vptr_CVmObject = '%';
        buf_00 = (CVmObjDate *)((long)&buf_00[-1].super_CVmObject.ext_ + 7);
        pCVar14 = (CVmObjDate *)((long)&(pCVar14->super_CVmObject)._vptr_CVmObject + 1);
      }
      break;
    default:
      if (buf_00 != (CVmObjDate *)0x0) {
        *(char *)&(pCVar14->super_CVmObject)._vptr_CVmObject = '%';
        buf_00 = (CVmObjDate *)((long)&buf_00[-1].super_CVmObject.ext_ + 7);
        pCVar14 = (CVmObjDate *)((long)&(pCVar14->super_CVmObject)._vptr_CVmObject + 1);
      }
      local_58 = local_58 + 2;
      if (buf_00 != (CVmObjDate *)0x0) {
        in_RDX = (CVmObjDate *)((long)&(pCVar14->super_CVmObject)._vptr_CVmObject + 1);
        *(char *)&(pCVar14->super_CVmObject)._vptr_CVmObject = *in_RCX;
        buf_00 = (CVmObjDate *)((long)&buf_00[-1].super_CVmObject.ext_ + 7);
        pCVar14 = in_RDX;
      }
      break;
    case (size_t *)0x1c:
      pCVar13 = pCVar11;
      uVar3 = (**(code **)(*(long *)CONCAT44(in_stack_0000000c,in_stack_00000008) + 0x20))();
      in_R9 = (CVmDateLocale *)(ulong)uVar3;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 = (char *)((ulong)in_stack_fffffffffffffdd8 & 0xffffffff00000000);
      _wrtlistitem((char **)in_stack_fffffffffffffe00,
                   (size_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (size_t *)in_stack_fffffffffffffdf0,
                   (CVmDateLocale *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),(int)in_stack_fffffffffffffde0,
                   in_stack_fffffffffffffe10);
      in_RDX = extraout_RDX_00;
      in_stack_fffffffffffffe30 = pCVar11;
      pCVar11 = pCVar13;
      break;
    case (size_t *)0x1d:
      pCVar13 = pCVar11;
      multicaldate_t::m((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008),in_RSI,iVar4
                        ,(char *)&switchD_002f16ce::switchdataD_00384d7c,iVar7,iVar8);
      in_R9 = (CVmDateLocale *)(ulong)(extraout_EAX_00 - 1);
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x0;
      in_stack_fffffffffffffdd8 = (char *)((ulong)in_stack_fffffffffffffdd8 & 0xffffffff00000000);
      _wrtlistitem((char **)in_stack_fffffffffffffe00,
                   (size_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (size_t *)in_stack_fffffffffffffdf0,
                   (CVmDateLocale *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),(int)in_stack_fffffffffffffde0,
                   in_stack_fffffffffffffe10);
      in_RDX = extraout_RDX_11;
      in_stack_fffffffffffffe08 = pCVar11;
      pCVar11 = pCVar13;
      break;
    case (size_t *)0x1e:
      multicaldate_t::y((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)local_65);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_13;
      break;
    case (size_t *)0x1f:
      lc_00 = CVmDateLocale::get(in_stack_fffffffffffffe08,(size_t *)in_stack_fffffffffffffe00,
                                 in_stack_fffffffffffffdfc);
      in_R9 = pCVar11;
      in_RSI = pCVar14;
      goto LAB_002f23a7;
    case (size_t *)0x20:
    case (size_t *)0x40:
      iVar4 = multicaldate_t::y((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      local_134 = (uint)(iVar4 < 1);
      uVar3 = (uint)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      iVar4 = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
      if ((((*in_RCX == 'e') && (local_60 != 0)) ||
          ((*in_RCX == 'E' && ((local_60 == 0 && (local_134 == 0)))))) ||
         ((*in_RCX == 'E' && ((local_60 != 0 && (local_134 == 1)))))) {
        _wrtlistitem((char **)in_stack_fffffffffffffe00,
                     (size_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (size_t *)in_stack_fffffffffffffdf0,
                     (CVmDateLocale *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                     iVar4,(int)in_stack_fffffffffffffde0,in_stack_fffffffffffffe10);
        local_58 = local_58 + 1;
        if (buf_00 == (CVmObjDate *)0x0) {
          buf_00 = (CVmObjDate *)0x0;
        }
        else {
          *(char *)&(pCVar14->super_CVmObject)._vptr_CVmObject = ' ';
          buf_00 = (CVmObjDate *)((long)&buf_00[-1].super_CVmObject.ext_ + 7);
          pCVar14 = (CVmObjDate *)((long)&(pCVar14->super_CVmObject)._vptr_CVmObject + 1);
        }
        in_R9 = (CVmDateLocale *)(ulong)local_5c;
        in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
        in_R8 = (char *)0x1;
        in_stack_fffffffffffffdd8 = (char *)CONCAT44(uVar3,(int)local_65);
        in_stack_fffffffffffffde0 =
             (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
        _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
                (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
                (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
                in_stack_fffffffffffffe68);
        in_RDX = extraout_RDX_17;
      }
      else {
        in_stack_fffffffffffffde0 = (bignum_t<32> *)CONCAT44(iVar4,local_64);
        _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
                (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
                (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
                in_stack_fffffffffffffe68);
        local_58 = local_58 + 1;
        if (buf_00 == (CVmObjDate *)0x0) {
          buf_00 = (CVmObjDate *)0x0;
        }
        else {
          *(char *)&(pCVar14->super_CVmObject)._vptr_CVmObject = ' ';
          buf_00 = (CVmObjDate *)((long)&buf_00[-1].super_CVmObject.ext_ + 7);
          pCVar14 = (CVmObjDate *)((long)&(pCVar14->super_CVmObject)._vptr_CVmObject + 1);
        }
        in_R9 = (CVmDateLocale *)(ulong)local_134;
        in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
        in_R8 = (char *)0x5;
        in_stack_fffffffffffffdd8 = (char *)((ulong)uVar3 << 0x20);
        _wrtlistitem((char **)in_stack_fffffffffffffe00,
                     (size_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (size_t *)in_stack_fffffffffffffdf0,
                     (CVmDateLocale *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                     (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),(int)in_stack_fffffffffffffde0,
                     in_stack_fffffffffffffe10);
        in_RDX = extraout_RDX_18;
      }
      break;
    case (size_t *)0x21:
      lc_00 = "%Y-%m-%d";
      local_50 = (char *)0x8;
      in_R9 = pCVar11;
      in_RSI = pCVar14;
      goto LAB_002f23a7;
    case (size_t *)0x22:
    case (size_t *)0x42:
      (**(code **)(*(long *)CONCAT44(in_stack_0000000c,in_stack_00000008) + 0x30))
                ((long *)CONCAT44(in_stack_0000000c,in_stack_00000008),local_11c);
      in_R8 = (char *)0x4;
      if (*in_RCX == 'g') {
        in_R8 = (char *)0x2;
      }
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_stack_fffffffffffffdd8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)local_65);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_14;
      break;
    case (size_t *)0x23:
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 = (char *)CONCAT44(uVar3,(int)local_65);
      in_stack_fffffffffffffde0 = (bignum_t<32> *)CONCAT44(item,local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,v,ndigits,
              pound_00,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_19;
      break;
    case (size_t *)0x24:
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 = (char *)CONCAT44(uVar3,(int)local_65);
      in_stack_fffffffffffffde0 = (bignum_t<32> *)CONCAT44(item,local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,v,ndigits,
              pound_00,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_20;
      break;
    case (size_t *)0x25:
      iVar2 = get_dayno((CVmObjDate *)0x2f187b);
      local_88 = (long)iVar2;
      iVar2 = get_daytime((CVmObjDate *)0x2f188f);
      local_90 = (long)iVar2;
      if (43200000 < local_90) {
        local_88 = local_88 + 1;
        local_90 = local_90 + -43200000;
      }
      bignum_t<32>::bignum_t(in_stack_fffffffffffffde0,(long)in_stack_fffffffffffffdd8);
      bignum_t<32>::bignum_t(in_stack_fffffffffffffde0,(long)in_stack_fffffffffffffdd8);
      bignum_t<32>::operator+=
                ((bignum_t<32> *)in_stack_fffffffffffffe00,
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      bignum_t<32>::operator/
                ((bignum_t<32> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (long)in_stack_fffffffffffffe08);
      in_stack_fffffffffffffdec = CONCAT31((int3)((uint)in_stack_fffffffffffffdec >> 8),local_bc);
      b.ext._8_8_ = in_stack_fffffffffffffe08;
      b.ext._0_8_ = in_stack_fffffffffffffe00;
      b.ext[0x10] = (char)in_stack_fffffffffffffe10;
      b.ext[0x11] = (char)((uint)in_stack_fffffffffffffe10 >> 8);
      b.ext[0x12] = (char)((uint)in_stack_fffffffffffffe10 >> 0x10);
      b.ext[0x13] = (char)((uint)in_stack_fffffffffffffe10 >> 0x18);
      b.ext[0x14] = (char)in_stack_fffffffffffffe14;
      in_stack_fffffffffffffdd8 = local_d0;
      in_stack_fffffffffffffde0 = local_c8;
      in_stack_fffffffffffffde8 = local_c0;
      bignum_t<32>::operator+=(in_stack_fffffffffffffdf0,b);
      bignum_t<32>::format
                ((bignum_t<32> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (char *)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00,
                 in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
      in_R8 = (char *)vmb_get_len((char *)0x2f199d);
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      _wrtstrl((char **)in_stack_fffffffffffffdf0,
               (size_t *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               (size_t *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,0x2f19c2);
      in_RDX = extraout_RDX_03;
      break;
    case (size_t *)0x28:
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 = (char *)CONCAT44(uVar3,(int)local_65);
      in_stack_fffffffffffffde0 = (bignum_t<32> *)CONCAT44(item,local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,v,ndigits,
              pound_00,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_21;
      break;
    case (size_t *)0x29:
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x3;
      in_stack_fffffffffffffdd8 = (char *)CONCAT44(uVar3,(int)local_65);
      in_stack_fffffffffffffde0 = (bignum_t<32> *)CONCAT44(item,local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,v,ndigits,
              pound_00,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_26;
      break;
    case (size_t *)0x2b:
      in_R9 = (CVmDateLocale *)(ulong)(0xb < in_stack_00000018 / 3600000);
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x4;
      in_stack_fffffffffffffdd8 = (char *)((ulong)uVar3 << 0x20);
      _wrtlistitem((char **)in_stack_fffffffffffffe00,
                   (size_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (size_t *)in_stack_fffffffffffffdf0,
                   (CVmDateLocale *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   item,(int)in_stack_fffffffffffffde0,in_stack_fffffffffffffe10);
      in_RDX = extraout_RDX_22;
      break;
    case (size_t *)0x2d:
      lc_00 = CVmDateLocale::get(in_stack_fffffffffffffe08,(size_t *)in_stack_fffffffffffffe00,
                                 in_stack_fffffffffffffdfc);
      in_R9 = pCVar11;
      in_RSI = pCVar14;
      goto LAB_002f23a7;
    case (size_t *)0x2e:
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 = (char *)CONCAT44(uVar3,(int)local_65);
      in_stack_fffffffffffffde0 = (bignum_t<32> *)CONCAT44(item,local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,v,ndigits,
              pound_00,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_25;
      break;
    case (size_t *)0x2f:
      lc_00 = CVmDateLocale::get(in_stack_fffffffffffffe08,(size_t *)in_stack_fffffffffffffe00,
                                 in_stack_fffffffffffffdfc);
      in_R9 = pCVar11;
      in_RSI = pCVar14;
      goto LAB_002f23a7;
    case (size_t *)0x30:
      multicaldate_t::weekno(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)local_65);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_07;
      break;
    case (size_t *)0x31:
      (**(code **)(*(long *)CONCAT44(in_stack_0000000c,in_stack_00000008) + 0x30))
                ((long *)CONCAT44(in_stack_0000000c,in_stack_00000008),0);
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)local_65);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_09;
      break;
    case (size_t *)0x32:
      multicaldate_t::weekno(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)local_65);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_08;
      break;
    case (size_t *)0x33:
      lc_00 = CVmDateLocale::get(in_stack_fffffffffffffe08,(size_t *)in_stack_fffffffffffffe00,
                                 in_stack_fffffffffffffdfc);
      in_R9 = pCVar11;
      in_RSI = pCVar14;
      goto LAB_002f23a7;
    case (size_t *)0x34:
      multicaldate_t::y((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x4;
      in_stack_fffffffffffffdd8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)local_65);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_16;
      break;
    case (size_t *)0x35:
      if (in_stack_00000028 < 0) {
        if (buf_00 != (CVmObjDate *)0x0) {
          *(char *)&(pCVar14->super_CVmObject)._vptr_CVmObject = '-';
          buf_00 = (CVmObjDate *)((long)&buf_00[-1].super_CVmObject.ext_ + 7);
          pCVar14 = (CVmObjDate *)((long)&(pCVar14->super_CVmObject)._vptr_CVmObject + 1);
        }
      }
      else if (buf_00 != (CVmObjDate *)0x0) {
        *(char *)&(pCVar14->super_CVmObject)._vptr_CVmObject = '+';
        buf_00 = (CVmObjDate *)((long)&buf_00[-1].super_CVmObject.ext_ + 7);
        pCVar14 = (CVmObjDate *)((long)&(pCVar14->super_CVmObject)._vptr_CVmObject + 1);
      }
      local_58 = local_58 + 1;
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,v,ndigits,
              pound_00,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
      local_5c = 0;
      in_R9 = (CVmDateLocale *)0x0;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 = (char *)CONCAT44(uVar3,(int)local_65);
      in_stack_fffffffffffffde0 = (bignum_t<32> *)CONCAT44(item,local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_27;
      break;
    case (size_t *)0x3c:
      pCVar13 = pCVar11;
      uVar3 = (**(code **)(*(long *)CONCAT44(in_stack_0000000c,in_stack_00000008) + 0x20))();
      in_R9 = (CVmDateLocale *)(ulong)uVar3;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x3;
      in_stack_fffffffffffffdd8 = (char *)((ulong)in_stack_fffffffffffffdd8 & 0xffffffff00000000);
      _wrtlistitem((char **)in_stack_fffffffffffffe00,
                   (size_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (size_t *)in_stack_fffffffffffffdf0,
                   (CVmDateLocale *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),(int)in_stack_fffffffffffffde0,
                   in_stack_fffffffffffffe10);
      in_RDX = extraout_RDX;
      in_stack_fffffffffffffe38 = pCVar11;
      pCVar11 = pCVar13;
      break;
    case (size_t *)0x3d:
      in_stack_fffffffffffffe10 = (int)pCVar11;
      in_stack_fffffffffffffe14 = (undefined4)((ulong)pCVar11 >> 0x20);
      multicaldate_t::m((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008),in_RSI,iVar4
                        ,(char *)&switchD_002f16ce::switchdataD_00384d7c,iVar7,iVar8);
      in_R9 = (CVmDateLocale *)(ulong)(extraout_EAX - 1);
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x1;
      in_stack_fffffffffffffdd8 = (char *)((ulong)in_stack_fffffffffffffdd8 & 0xffffffff00000000);
      _wrtlistitem((char **)in_stack_fffffffffffffe00,
                   (size_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (size_t *)in_stack_fffffffffffffdf0,
                   (CVmDateLocale *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),(int)in_stack_fffffffffffffde0,
                   in_stack_fffffffffffffe10);
      in_RDX = extraout_RDX_10;
      break;
    case (size_t *)0x3e:
      lc_00 = CVmDateLocale::get(in_stack_fffffffffffffe08,(size_t *)in_stack_fffffffffffffe00,
                                 in_stack_fffffffffffffdfc);
      in_R9 = pCVar11;
      in_RSI = pCVar14;
      goto LAB_002f23a7;
    case (size_t *)0x3f:
      multicaldate_t::d((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)local_65);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_01;
      break;
    case (size_t *)0x45:
      iVar4 = multicaldate_t::y((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      uVar10 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
      uVar9 = (undefined4)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      caldate_t::caldate_t(&local_78,iVar4,1,1);
      iVar2 = caldate_t::dayno((caldate_t *)in_stack_fffffffffffffe00);
      local_7c = (in_stack_00000010 - iVar2) + 1;
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x3;
      in_stack_fffffffffffffdd8 = (char *)CONCAT44(uVar9,(int)local_65);
      in_stack_fffffffffffffde0 = (bignum_t<32> *)CONCAT44(uVar10,local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_02;
      break;
    case (size_t *)0x48:
      multicaldate_t::m((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008),in_RSI,iVar4
                        ,(char *)&switchD_002f16ce::switchdataD_00384d7c,iVar7,iVar8);
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)local_65);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_12;
      break;
    case (size_t *)0x4b:
      in_R9 = (CVmDateLocale *)0x2;
      if (0xb < in_stack_00000018 / 3600000) {
        in_R9 = (CVmDateLocale *)0x3;
      }
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x4;
      in_stack_fffffffffffffdd8 = (char *)((ulong)uVar3 << 0x20);
      _wrtlistitem((char **)in_stack_fffffffffffffe00,
                   (size_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (size_t *)in_stack_fffffffffffffdf0,
                   (CVmDateLocale *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   item,(int)in_stack_fffffffffffffde0,in_stack_fffffffffffffe10);
      in_RDX = extraout_RDX_23;
      break;
    case (size_t *)0x4d:
      lc_00 = CVmDateLocale::get(in_stack_fffffffffffffe08,(size_t *)in_stack_fffffffffffffe00,
                                 in_stack_fffffffffffffdfc);
      in_R9 = pCVar11;
      in_RSI = pCVar14;
      goto LAB_002f23a7;
    case (size_t *)0x4e:
      sprintf(local_1a8,"%.0lf",
              ((double)(in_stack_00000010 + -0xafa6c) * 24.0 * 60.0 * 60.0 +
              (double)(in_stack_00000018 / 1000)) - (double)(in_stack_00000028 / 1000),
              (long)in_stack_00000028 % 1000 & 0xffffffff);
      in_stack_fffffffffffffe00 = (multicaldate_t *)local_1a8;
      in_R8 = (char *)strlen(local_1a8);
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      _wrtstrl((char **)in_stack_fffffffffffffdf0,
               (size_t *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               (size_t *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,0x2f2938);
      in_RDX = extraout_RDX_28;
      break;
    case (size_t *)0x4f:
      multicaldate_t::d((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      uVar9 = (undefined4)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      iVar4 = multicaldate_t::d((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      uVar3 = ordinal_index(iVar4);
      in_R9 = (CVmDateLocale *)(ulong)uVar3;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x7;
      in_stack_fffffffffffffdd8 = (char *)CONCAT44(uVar9,1);
      _wrtlistitem((char **)in_stack_fffffffffffffe00,
                   (size_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (size_t *)in_stack_fffffffffffffdf0,
                   (CVmDateLocale *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),(int)in_stack_fffffffffffffde0,
                   in_stack_fffffffffffffe10);
      in_RDX = extraout_RDX_06;
      break;
    case (size_t *)0x50:
      (**(code **)(*(long *)CONCAT44(in_stack_0000000c,in_stack_00000008) + 0x28))();
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x1;
      in_stack_fffffffffffffdd8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)local_65);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_04;
      break;
    case (size_t *)0x52:
      (**(code **)(*(long *)CONCAT44(in_stack_0000000c,in_stack_00000008) + 0x20))();
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x1;
      in_stack_fffffffffffffdd8 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)local_65);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_05;
      break;
    case (size_t *)0x53:
      lc_00 = CVmDateLocale::get(in_stack_fffffffffffffe08,(size_t *)in_stack_fffffffffffffe00,
                                 in_stack_fffffffffffffdfc);
      in_R9 = pCVar11;
      in_RSI = pCVar14;
LAB_002f23a7:
      in_stack_fffffffffffffdd8 = (char *)CONCAT44(in_stack_0000000c,in_stack_00000008);
      in_stack_fffffffffffffdf0 = (bignum_t<32> *)CONCAT44(in_stack_00000024,in_stack_00000020);
      in_stack_fffffffffffffde0 =
           (bignum_t<32> *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_00000010);
      in_R8 = local_50;
      in_stack_fffffffffffffde8 = in_stack_00000018;
      in_stack_fffffffffffffdf8 = in_stack_00000028;
      pCVar11 = in_R9;
      pCVar14 = in_RSI;
      pCVar5 = (CVmObjDate *)
               format_date(in_RSI,(char *)buf_00,(size_t)in_RCX,fmt_00,(size_t)in_R9,
                           (CVmDateLocale *)lc_00,unaff_retaddr,in_stack_00000008,in_stack_00000010,
                           (char *)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000020);
      local_58 = (char *)((long)&(pCVar5->super_CVmObject)._vptr_CVmObject + (long)local_58);
      if (buf_00 < pCVar5) {
        pCVar6 = (CVmObjDate *)0x0;
      }
      else {
        pCVar6 = (CVmObjDate *)((long)buf_00 - (long)pCVar5);
        buf_00 = pCVar5;
      }
      pCVar1 = &buf_00->super_CVmObject;
      in_RDX = extraout_RDX_24;
      buf_00 = pCVar6;
      pCVar14 = (CVmObjDate *)
                ((long)&pCVar1->_vptr_CVmObject + (long)&(pCVar14->super_CVmObject)._vptr_CVmObject)
      ;
      break;
    case (size_t *)0x54:
      iVar4 = multicaldate_t::y((multicaldate_t *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      uVar10 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
      uVar9 = (undefined4)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      ldiv((long)iVar4,100);
      in_R9 = (CVmDateLocale *)(ulong)local_5c;
      in_RSI = (CVmObjDate *)&stack0xffffffffffffffd8;
      in_R8 = (char *)0x2;
      in_stack_fffffffffffffdd8 = (char *)CONCAT44(uVar9,(int)local_65);
      in_stack_fffffffffffffde0 = (bignum_t<32> *)CONCAT44(uVar10,local_64);
      _wrtnum(in_RDI,(size_t *)CONCAT17(uVar12,in_stack_fffffffffffffe48),outlen_00,
              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe60,
              in_stack_fffffffffffffe68);
      in_RDX = extraout_RDX_15;
      break;
    case (size_t *)0x55:
      for (local_150 = (char *)CONCAT44(in_stack_00000024,in_stack_00000020); *local_150 != '\0';
          local_150 = local_150 + 1) {
        local_58 = local_58 + 1;
        if (buf_00 != (CVmObjDate *)0x0) {
          in_RDX = (CVmObjDate *)((long)&(pCVar14->super_CVmObject)._vptr_CVmObject + 1);
          *(char *)&(pCVar14->super_CVmObject)._vptr_CVmObject = *local_150;
          buf_00 = (CVmObjDate *)((long)&buf_00[-1].super_CVmObject.ext_ + 7);
          pCVar14 = in_RDX;
        }
      }
    }
LAB_002f2ac1:
    in_RCX = in_RCX + 1;
    fmt_00 = fmt_00 + -1;
  } while( true );
}

Assistant:

size_t CVmObjDate::format_date(VMG_ char *buf, size_t buflen,
                               const char *fmt, size_t fmtlen,
                               CVmDateLocale *lc,
                               const multicaldate_t *date,
                               int32_t dayno, int32_t daytime,
                               const char *tzabbr, int32_t tzofs) const
{
    const char *subfmt;
    size_t subfmtl;
    
    /* we haven't written anything to the buffer yet */
    size_t outlen = 0;

    /* scan the format string */
    for ( ; fmtlen != 0 ; ++fmt, --fmtlen)
    {
        if (*fmt == '%' && fmtlen >= 2)
        {
            /* skip the '%' */
            ++fmt, --fmtlen;

            /* parse flags */
            int pound = FALSE;
            int minus = FALSE;
            int roman = FALSE;
            char leadsp = 0;
            for (int found_flag = TRUE ; found_flag && fmtlen >= 2 ; )
            {
                /* assume we won't find another flag on this pass */
                found_flag = FALSE;
                
                /* check for the '#' flag (meaning varies by format code) */
                if (fmtlen >= 2 && *fmt == '#')
                {
                    pound = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }
                
                /* ' ' and '\ ' (replace leading zeros with spaces) */
                if (fmtlen >= 2 && (*fmt == ' ' || *fmt == 0x15))
                {
                    leadsp = *fmt;
                    found_flag = TRUE;
                    ++fmt, --fmtlen;
                }

                /* check for '-' flag */
                if (fmtlen >= 2 && *fmt == '-')
                {
                    minus = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }

                /* check for '&' flag */
                if (fmtlen >= 2 && *fmt == '&')
                {
                    roman = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }
            }

            /* get the format code */
            switch (*fmt)
            {
            case 'a':
                /* abbreviated day name */
                wrtlistitem(LC_WKDY, date->weekday(), FALSE);
                break;

            case 'A':
                /* full day name */
                wrtlistitem(LC_WEEKDAY, date->weekday(), FALSE);
                break;

            case 'd':
                /* two-digit day of month (or one digit with '#') */
                wrtnum(date->d(), 2);
                break;

            case 'j':
                /* day of year 001-366, three digits with leading zeros */
                {
                    /* 
                     *   we can calculate the day of the year by subtracting
                     *   the day number of Jan 1 from the given date (and
                     *   adding 1 to get into range 1-366) 
                     */
                    caldate_t jan1(date->y(), 1, 1);
                    int j = dayno - jan1.dayno() + 1;
                    wrtnum(j, 3);
                }
                break;

            case 'J':
                /* 
                 *   Julian day number (the 4713 BC kind); '#' suppresses the
                 *   fractional part 
                 */
                {
                    /* get the day and time */
                    long dn = get_dayno(), dt = get_daytime();

                    /* if the time is past noon, it's on the next day */
                    if (dt > 12*60*60*1000)
                        dn += 1, dt -= 12*60*60*1000;

                    /* 
                     *   figure the combined date/time value, adjusting the
                     *   day number to the Julian day Epoch 
                     */
                    bignum_t<32> bdn(dn), bdt(dt);
                    bdn += 1721119L;
                    bdn += (bdt / (long)(24*60*60*1000));

                    /* format it and write it */
                    char jbuf[64];
                    bdn.format(jbuf, sizeof(jbuf), -1, 10);
                    wrttstr(jbuf);
                }
                break;

            case 'u':
                /* day of week 1-7 Monday-Sunday (ISO weekday) */
                wrtnum(date->iso_weekday(), 1);
                break;

            case 'w':
                /* day of week 0-6 Sunday-Saturday */
                wrtnum(date->weekday(), 1);
                break;

            case 't':
                /* day of month with ordinal suffix (non-strftime) */
                wrtnum(date->d(), 1);
                wrtlistitem(LC_ORDSUF, ordinal_index(date->d()), TRUE);
                break;

            case 'U':
                /* week number, 00-53, week 1 starting with first Sunday */
                wrtnum(date->weekno(0), 2);
                break;

            case 'W':
                /* week number, 00-53, week 1 starting with first Monday */
                wrtnum(date->weekno(1), 2);
                break;

            case 'V':
                /* ISO-8601:1988 week number of the year */
                wrtnum(date->iso_weekno(0), 2);
                break;

            case 'b':
                /* abbreviated month name */
                wrtlistitem(LC_MON, date->m() - 1, FALSE);
                break;

            case 'B':
                /* full month name */
                wrtlistitem(LC_MONTH, date->m() - 1, FALSE);
                break;

            case 'm':
                /* two-digit month 01-12 (one digit with #) */
                wrtnum(date->m(), 2);
                break;

            case 'C':
                /* two-digit century (e.g., 19 for 1900-1999) */
                wrtnum(date->y() / 100, 2);
                break;

            case 'g':
            case 'G':
                /* ISO-8601:1988 year ('g'=2 digits, 'G'=4 digits) */
                {
                    /* ISO-8601:1988 week number of the year */
                    int iy;
                    date->iso_weekno(&iy);
                    wrtnum(iy, *fmt == 'g' ? 2 : 4);
                }
                break;

            case 'y':
                /* two-digit year */
                wrtnum(ldiv(date->y(), 100).rem, 2);
                break;

            case 'Y':
                /* four-digit year */
                wrtnum(date->y(), 4);
                break;

            case 'e':
            case 'E':
                /* 
                 *   Year with AD/BC era before/after the year number.  For
                 *   'e', the era is always after, or always before on '-'.
                 *   For 'E', the era is AD before/BC after, or reversed on
                 *   '-'. 
                 */
                {
                    /* figure the era: positive years are AD, <=0 are BC */
                    int idx = 0; // assume AD
                    int yy = date->y();
                    if (yy <= 0)
                    {
                        idx = 1; // BC
                        yy = -yy + 1;
                    }

                    /* 
                     *   Figure the display order: "%-e" puts the era first
                     *   in all case; "%E" puts AD first; "%-E" puts BC first
                     */
                    if ((*fmt == 'e' && minus)
                        || (*fmt == 'E' && !minus && idx == 0)
                        || (*fmt == 'E' && minus && idx == 1))
                    {
                        /* era first */
                        wrtlistitem(LC_ERA, idx, FALSE);
                        wrtch(' ');
                        wrtnum(yy, 1);
                    }
                    else
                    {
                        /* year first */
                        wrtnum(yy, 1);
                        wrtch(' ');
                        wrtlistitem(LC_ERA, idx, FALSE);
                    }
                }
                break;

            case 'H':
                /* two-digit hour, 24-hour clock */
                wrtnum(daytime/(60*60*1000), 2);
                break;

            case 'I':
                /* two-digit hour, 12-hour clock */
                {
                    int hh = daytime/(60*60*1000);
                    if (hh == 0)
                        hh = 12;
                    else if (hh >= 13)
                        hh -= 12;

                    wrtnum(hh, 2);
                }
                break;

            case 'M':
                /* two-digit minute */
                wrtnum(daytime/(60*1000) % 60, 2);
                break;

            case 'P':
                /* upper-case AM or PM */
                wrtlistitem(LC_AMPM, daytime/(60*60*1000) >= 12 ? 1 : 0, FALSE);
                break;

            case 'p':
                /* lower-case am or pm */
                wrtlistitem(LC_AMPM, daytime/(60*60*1000) >= 12 ? 3 : 2, FALSE);
                break;

            case 'r':
                /* full 12-hour clock time: %I:%M:%S %P */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_12HOUR);
                goto do_subfmt;

            do_subfmt:
                {
                    /* recursively format the new format string */
                    size_t l = format_date(
                        vmg_ buf, buflen, subfmt, subfmtl, lc,
                        date, dayno, daytime, tzabbr, tzofs);

                    /* count it in our output length */
                    outlen += l;

                    /* advance our buffer pointer past the copied text */
                    if (buflen >= l)
                        buflen -= l, buf += l;
                    else
                        buf += buflen, buflen = 0;
                }
                break;

            case 'R':
                /* 24-hour clock time w/minutes: %H:%M */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_24HOUR);
                goto do_subfmt;

            case 'S':
                /* two-digit seconds */
                wrtnum(daytime/1000 % 60, 2);
                break;

            case 'N':
                /* three-digit milliseconds (non-strftime) */
                wrtnum(daytime % 1000, 3);
                break;

            case 'T':
                /* 24-hour clock time w/seconds: %H:%M:%S */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_24HOURSECS);
                goto do_subfmt;

            case 'X':
                /* locale time representation without the date */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_TIME);
                goto do_subfmt;

            case 'z':
                /* time zone abbreviation */
                {
                    for (const char *p = tzabbr ; *p != '\0' ; ++p)
                        wrtch(*p);
                }
                break;

            case 'Z':
                /* time zone UTC offset, four digits (+0500) */
                {
                    int32_t o = tzofs;
                    if (o < 0)
                        wrtch('-'), o = -o;
                    else
                        wrtch('+');

                    wrtnum(o/(60*60*1000), 2);
                    pound = FALSE;
                    wrtnum(o/(60*1000) % 60, 2);
                }
                break;

            case 'c':
                /* preferred locale date and time stamp */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_TIMESTAMP);
                goto do_subfmt;

            case 'D':
                /* short date - %m/%d/%y */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_SHORTDATE);
                goto do_subfmt;

            case 'F':
                /* database-style date: %Y-%m-%d */
                subfmt = "%Y-%m-%d";
                subfmtl = 8;
                goto do_subfmt;

            case 's':
                /* Unix Epoch timestamp as an integer */
                {
                    /* 
                     *   The Unix timestamp is the number of seconds after
                     *   (or before, if negative) 1/1/1970 00:00 UTC.  First
                     *   calculate the number of days after (before) 1/1/1970
                     *   by subtracting the Unix Epoch day number from our
                     *   internal day number; then multiply that by the
                     *   number of seconds in a day (24*60*60) to get the
                     *   Unix timestamp of midnight on that day, then add the
                     *   number of seconds into the day ('daytime' stores
                     *   milliseconds, so divide it by 1000).
                     *   
                     *   Note that we need to adjust back to UTC by
                     *   subtracting the time zone offset.
                     *   
                     *   As we've discussed elsewhere in this file, a double
                     *   is big enough for the Unix timestamp value for any
                     *   day number we can store, and represents it exactly
                     *   since we're working in whole numbers.
                     */
                    double utime = (dayno - caldate_t::UNIX_EPOCH_DAYNO)
                                   * 24.*60.*60.
                                   + daytime/1000
                                   - tzofs/1000;

                    /* format it to a buffer and copy to the output */
                    char ubuf[60];
                    sprintf(ubuf, "%.0lf", utime);
                    wrtstr(ubuf);
                }
                break;

            case 'x':
                /* preferred locale date representation */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_DATE);
                goto do_subfmt;

            case '%':
                /* a literal % */
                wrtch('%');
                break;

            default:
                /* 
                 *   anything else is an error; copy the whole %x literally
                 *   to make the unparsed format character apparent
                 */
                wrtch('%');
                wrtch(*fmt);
                break;
            }
        }
        else
        {
            /* it's an ordinary character, so copy it literally */
            wrtch(*fmt);
        }
    }

    /* add a nul if there's room (but don't count it in the result length) */
    if (buflen > 0)
        *buf++ = '\0';

    /* return the total space needed */
    return outlen;
}